

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

void slang::bitcpy(uint64_t *dest,uint32_t destOffset,uint64_t *src,uint32_t length,
                  uint32_t srcOffset)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  sbyte sVar4;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint64_t srcWord_1;
  uint64_t mask_1;
  uint32_t i;
  uint64_t mask;
  uint64_t srcWord;
  uint32_t bitsToWrite;
  uint32_t BitsPerWord;
  ulong local_68;
  ulong local_58;
  uint local_44;
  ulong local_38;
  uint local_2c [2];
  undefined4 local_24;
  uint local_20;
  uint local_1c;
  ulong *local_18;
  uint local_c;
  ulong *local_8;
  
  if (in_ECX != 0) {
    local_24 = 0x40;
    local_8 = (ulong *)(in_RDI + (ulong)(in_ESI >> 6) * 8);
    local_c = in_ESI & 0x3f;
    local_18 = (ulong *)(in_RDX + (ulong)(in_R8D >> 6) * 8);
    local_20 = in_R8D & 0x3f;
    local_1c = in_ECX;
    if (local_c != 0) {
      local_2c[0] = 0x40 - local_c;
      puVar2 = std::min<unsigned_int>(&local_1c,local_2c);
      uVar1 = *puVar2;
      local_1c = local_1c - uVar1;
      if (local_20 == 0) {
        local_38 = *local_18;
      }
      else {
        local_38 = *local_18 >> ((byte)local_20 & 0x3f);
        if (0x40 - local_20 < uVar1) {
          local_38 = local_18[1] << (0x40 - (byte)local_20 & 0x3f) | local_38;
        }
      }
      uVar3 = (1L << ((byte)uVar1 & 0x3f)) - 1;
      *local_8 = *local_8 & (uVar3 << ((byte)local_c & 0x3f) ^ 0xffffffffffffffff) |
                 (local_38 & uVar3) << ((byte)local_c & 0x3f);
      local_8 = local_8 + 1;
      local_18 = local_18 + (uVar1 + local_20 >> 6);
      local_20 = uVar1 + local_20 & 0x3f;
    }
    for (local_44 = 0; sVar4 = (sbyte)local_20, local_44 < local_1c >> 6; local_44 = local_44 + 1) {
      if (local_20 == 0) {
        local_68 = *local_18;
      }
      else {
        local_68 = *local_18 >> sVar4 | local_18[1] << (0x40U - sVar4 & 0x3f);
      }
      *local_8 = local_68;
      local_8 = local_8 + 1;
      local_18 = local_18 + 1;
    }
    local_1c = local_1c & 0x3f;
    if (local_1c != 0) {
      uVar3 = (1L << (sbyte)local_1c) - 1;
      if (local_20 == 0) {
        local_58 = *local_18;
      }
      else {
        local_58 = *local_18 >> sVar4;
        if (0x40 - local_20 < local_1c) {
          local_58 = local_18[1] << (0x40U - sVar4 & 0x3f) | local_58;
        }
      }
      *local_8 = *local_8 & (uVar3 ^ 0xffffffffffffffff) | local_58 & uVar3;
    }
  }
  return;
}

Assistant:

static void bitcpy(uint64_t* dest, uint32_t destOffset, const uint64_t* src, uint32_t length,
                   uint32_t srcOffset = 0) {
    if (length == 0)
        return;

    // Get the first word we want to write to, and the remaining bits are an offset.
    const uint32_t BitsPerWord = SVInt::BITS_PER_WORD;
    dest += destOffset / BitsPerWord;
    destOffset %= BitsPerWord;
    src += srcOffset / BitsPerWord;
    srcOffset %= BitsPerWord;

    // Writing to the first word is a special case, due to the bit offset
    if (destOffset) {
        uint32_t bitsToWrite = std::min(length, BitsPerWord - destOffset);
        length -= bitsToWrite;

        uint64_t srcWord;
        if (srcOffset) {
            // Be careful not to read past the bounds of the array.
            srcWord = *src >> srcOffset;
            if (BitsPerWord - srcOffset < bitsToWrite)
                srcWord |= src[1] << (BitsPerWord - srcOffset);
        }
        else {
            srcWord = *src;
        }

        uint64_t mask = (1ull << bitsToWrite) - 1;
        *dest = (*dest & ~(mask << destOffset)) | ((srcWord & mask) << destOffset);

        dest++;
        srcOffset += bitsToWrite;
        src += srcOffset / BitsPerWord;
        srcOffset %= BitsPerWord;
    }

    // Do a bulk copy of whole words, with all writes to dest word-aligned.
    for (uint32_t i = 0; i < length / BitsPerWord; i++) {
        *dest = srcOffset ? (*src >> srcOffset) | (src[1] << (BitsPerWord - srcOffset)) : *src;
        dest++;
        src++;
    }

    // Handle leftover bits in the final word.
    if (length %= BitsPerWord) {
        uint64_t mask = (1ull << length) - 1;
        uint64_t srcWord;
        if (srcOffset) {
            // Be careful not to read past the bounds of the array.
            srcWord = *src >> srcOffset;
            if (BitsPerWord - srcOffset < length)
                srcWord |= src[1] << (BitsPerWord - srcOffset);
        }
        else {
            srcWord = *src;
        }

        *dest = (*dest & ~mask) | (srcWord & mask);
    }
}